

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> * __thiscall
cmLocalGenerator::AddUnityFilesModeAuto
          (vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,string *lang,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configs,vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                   *filtered_sources,cmValue beforeInclude,cmValue afterInclude,
          string *filename_base,size_t batchSize)

{
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  *configs_00;
  string *target_00;
  bool bVar1;
  unsigned_long *puVar2;
  char *pcVar3;
  cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
  cVar4;
  string local_190;
  cmValue local_170;
  cmValue local_168;
  UnityBatchedSource *local_160;
  UnityBatchedSource *local_158;
  cmRange<__gnu_cxx::__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>_>
  local_150;
  UnitySource local_140;
  UnityBatchedSource *local_118;
  __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
  end;
  __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
  local_108;
  __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
  begin;
  cmAlphaNum local_f8;
  cmAlphaNum local_c8;
  undefined1 local_98 [8];
  string filename;
  unsigned_long local_68;
  size_t batch;
  size_t chunk;
  size_t itemsLeft;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  *local_48;
  vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
  *filtered_sources_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configs_local;
  string *lang_local;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *this_local;
  cmValue afterInclude_local;
  cmValue beforeInclude_local;
  vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_> *unity_files
  ;
  
  afterInclude_local = beforeInclude;
  this_local = (cmLocalGenerator *)afterInclude.Value;
  local_48 = filtered_sources;
  filtered_sources_local =
       (vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
        *)configs;
  configs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)lang;
  lang_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  if (batchSize == 0) {
    batchSize = std::
                vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
                ::size(filtered_sources);
  }
  itemsLeft._7_1_ = 0;
  std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::vector
            (__return_storage_ptr__);
  chunk = std::
          vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
          ::size(local_48);
  local_68 = 0;
  for (; chunk != 0; chunk = chunk - batch) {
    puVar2 = std::min<unsigned_long>(&chunk,&batchSize);
    batch = *puVar2;
    cmAlphaNum::cmAlphaNum(&local_c8,filename_base);
    cmAlphaNum::cmAlphaNum(&local_f8,"unity_");
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            configs_local,"C");
    pcVar3 = "_cxx.cxx";
    if (bVar1) {
      pcVar3 = "_c.c";
    }
    begin._M_current = (UnityBatchedSource *)pcVar3;
    cmStrCat<unsigned_long,char_const*>
              ((string *)local_98,&local_c8,&local_f8,&local_68,(char **)&begin);
    end._M_current =
         (UnityBatchedSource *)
         std::
         vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>
         ::begin(local_48);
    local_108 = __gnu_cxx::
                __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
                ::operator+(&end,local_68 * batchSize);
    local_160 = (UnityBatchedSource *)
                __gnu_cxx::
                __normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
                ::operator+(&local_108,batch);
    target_00 = lang_local;
    configs_00 = filtered_sources_local;
    local_158 = local_108._M_current;
    local_118 = local_160;
    cVar4 = cmMakeRange<__gnu_cxx::__normal_iterator<cmLocalGenerator::UnityBatchedSource_const*,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>,__gnu_cxx::__normal_iterator<cmLocalGenerator::UnityBatchedSource_const*,std::vector<cmLocalGenerator::UnityBatchedSource,std::allocator<cmLocalGenerator::UnityBatchedSource>>>>
                      (local_108,
                       (__normal_iterator<const_cmLocalGenerator::UnityBatchedSource_*,_std::vector<cmLocalGenerator::UnityBatchedSource,_std::allocator<cmLocalGenerator::UnityBatchedSource>_>_>
                        )local_160);
    local_168.Value = afterInclude_local.Value;
    local_170.Value = (string *)this_local;
    local_150 = cVar4;
    std::__cxx11::string::string((string *)&local_190,(string *)local_98);
    WriteUnitySource(&local_140,this,(cmGeneratorTarget *)target_00,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)configs_00,local_150,local_168,local_170,&local_190);
    std::vector<cmLocalGenerator::UnitySource,_std::allocator<cmLocalGenerator::UnitySource>_>::
    emplace_back<cmLocalGenerator::UnitySource>(__return_storage_ptr__,&local_140);
    UnitySource::~UnitySource(&local_140);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)local_98);
    local_68 = local_68 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmLocalGenerator::UnitySource>
cmLocalGenerator::AddUnityFilesModeAuto(
  cmGeneratorTarget* target, std::string const& lang,
  std::vector<std::string> const& configs,
  std::vector<UnityBatchedSource> const& filtered_sources,
  cmValue beforeInclude, cmValue afterInclude,
  std::string const& filename_base, size_t batchSize)
{
  if (batchSize == 0) {
    batchSize = filtered_sources.size();
  }

  std::vector<UnitySource> unity_files;
  for (size_t itemsLeft = filtered_sources.size(), chunk, batch = 0;
       itemsLeft > 0; itemsLeft -= chunk, ++batch) {

    chunk = std::min(itemsLeft, batchSize);

    std::string filename = cmStrCat(filename_base, "unity_", batch,
                                    (lang == "C") ? "_c.c" : "_cxx.cxx");
    auto const begin = filtered_sources.begin() + batch * batchSize;
    auto const end = begin + chunk;
    unity_files.emplace_back(this->WriteUnitySource(
      target, configs, cmMakeRange(begin, end), beforeInclude, afterInclude,
      std::move(filename)));
  }
  return unity_files;
}